

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_scalar_umul128(uint16_t *in,uint32_t n,uint32_t *out)

{
  ushort *puVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined8 uVar25;
  ulong uVar26;
  uint uVar27;
  int i;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar39 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  
  if (3 < n) {
    auVar43 = vmovdqu64_avx512f(*(undefined1 (*) [64])out);
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar45 = vpbroadcastq_avx512f(ZEXT816(0x1249124912491249));
    do {
      uVar27 = 0xfff;
      if (n < 0xfff) {
        uVar27 = n;
      }
      uVar27 = uVar27 & 0xffc;
      if (uVar27 == 0) {
        auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        uVar25 = 0;
      }
      else {
        auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar70 = ZEXT1664((undefined1  [16])0x0);
        auVar72 = ZEXT1664((undefined1  [16])0x0);
        auVar73 = ZEXT1664((undefined1  [16])0x0);
        auVar43 = vmovdqu64_avx512f(auVar43);
        uVar22 = 0xfff;
        if (n < 0xfff) {
          uVar22 = n;
        }
        auVar46 = vpbroadcastq_avx512f();
        auVar46 = vpsrlq_avx512f(auVar46,3);
        auVar46 = vmovdqu64_avx512f(auVar46);
        uVar24 = 0;
        do {
          auVar47 = vpbroadcastq_avx512f();
          auVar48 = vmovdqa64_avx512f(auVar45);
          auVar44 = vporq_avx512f(auVar47,auVar44);
          uVar4 = vpcmpuq_avx512f(auVar44,auVar46,2);
          auVar44 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in + uVar24 * 4));
          bVar2 = (byte)uVar4;
          auVar47._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar44._8_8_;
          auVar47._0_8_ = (ulong)(bVar2 & 1) * auVar44._0_8_;
          auVar47._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar44._16_8_;
          auVar47._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar44._24_8_;
          auVar47._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar44._32_8_;
          auVar47._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar44._40_8_;
          auVar47._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar44._48_8_;
          auVar47._56_8_ = (uVar4 >> 7) * auVar44._56_8_;
          auVar44 = vpandq_avx512f(auVar47,auVar45);
          uVar26 = vpextrq_avx(auVar44._0_16_,1);
          auVar40 = vextracti64x4_avx512f(auVar44,1);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = auVar44._0_8_;
          uVar29 = vpextrq_avx(auVar40._0_16_,1);
          uVar23 = vpextrq_avx(auVar40._16_16_,1);
          uVar30 = vpextrq_avx(auVar44._16_16_,1);
          auVar49 = vpsrlq_avx512f(auVar47,1);
          auVar49 = vpandq_avx512f(auVar49,auVar45);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar26;
          auVar41 = vextracti64x4_avx512f(auVar49,1);
          auVar31 = vextracti32x4_avx512vl(auVar41,1);
          auVar91._8_8_ = 0;
          auVar91._0_8_ = SUB168(auVar37 * ZEXT816(0x1000100010001),8);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = auVar44._16_8_;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar30;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = auVar40._0_8_;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar29;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = auVar40._16_8_;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar23;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = SUB168(auVar8 * ZEXT816(0x1000100010001),0);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = SUB168(auVar35 * ZEXT816(0x1000100010001),0);
          uVar23 = vpextrq_avx(auVar49._0_16_,1);
          auVar82._8_8_ = 0;
          auVar82._0_8_ = SUB168(auVar7 * ZEXT816(0x1000100010001),0);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = SUB168(auVar36 * ZEXT816(0x1000100010001),0);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = auVar49._0_8_;
          auVar32 = vextracti32x4_avx512vl(auVar49._0_32_,1);
          auVar44 = vpsrlq_avx512f(auVar47,2);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = SUB168(auVar6 * ZEXT816(0x1000100010001),0);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = SUB168(auVar5 * ZEXT816(0x1000100010001),0);
          auVar39 = vpunpcklqdq_avx(auVar76,auVar74);
          auVar33 = vpunpcklqdq_avx512vl(auVar86,auVar80);
          auVar34 = vpunpcklqdq_avx512vl(auVar88,auVar82);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = SUB168(auVar8 * ZEXT816(0x1000100010001),8);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = SUB168(auVar36 * ZEXT816(0x1000100010001),8);
          auVar36 = vpunpcklqdq_avx(auVar57,auVar54);
          auVar45 = vpandq_avx512f(auVar44,auVar45);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = SUB168(auVar7 * ZEXT816(0x1000100010001),8);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = SUB168(auVar35 * ZEXT816(0x1000100010001),8);
          auVar35 = vpunpcklqdq_avx(auVar60,auVar58);
          auVar40 = vinserti32x4_avx512vl(ZEXT1632(auVar34),auVar33,1);
          auVar66._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar35;
          auVar66._16_16_ = ZEXT116(1) * auVar36;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = SUB168(auVar38 * ZEXT816(0x1000100010001),8);
          auVar35 = vpunpcklqdq_avx512vl(auVar91,auVar67);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = SUB168(auVar6 * ZEXT816(0x1000100010001),8);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = SUB168(auVar5 * ZEXT816(0x1000100010001),8);
          auVar36 = vpunpcklqdq_avx(auVar64,auVar62);
          auVar42 = vextracti64x4_avx512f(auVar45,1);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar23;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = auVar32._0_8_;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = auVar32._8_8_;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = auVar41._0_8_;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = auVar41._8_8_;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = auVar31._0_8_;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = auVar31._8_8_;
          auVar44 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar36,
                                                   ZEXT116(0) * auVar36 + ZEXT116(1) * auVar35)),
                               auVar66,1);
          auVar78._8_8_ = 0;
          auVar78._0_8_ = SUB168(auVar38 * ZEXT816(0x1000100010001),0);
          auVar84._8_8_ = 0;
          auVar84._0_8_ = SUB168(auVar37 * ZEXT816(0x1000100010001),0);
          auVar36 = vpunpcklqdq_avx512vl(auVar84,auVar78);
          auVar41 = vinserti32x4_avx512vl(ZEXT1632(auVar36),auVar39,1);
          auVar101._8_8_ = 0;
          auVar101._0_8_ = SUB168(auVar13 * ZEXT816(0x1000100010001),0);
          uVar26 = vpextrq_avx(auVar42._0_16_,1);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = SUB168(auVar12 * ZEXT816(0x1000100010001),0);
          auVar49 = vinserti64x4_avx512f(ZEXT3264(auVar41),auVar40,1);
          auVar92._8_8_ = 0;
          auVar92._0_8_ = SUB168(auVar10 * ZEXT816(0x1000100010001),8);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = auVar45._0_8_;
          uVar29 = vpextrq_avx(auVar45._16_16_,1);
          auVar95._8_8_ = 0;
          auVar95._0_8_ = SUB168(auVar33 * ZEXT816(0x1000100010001),8);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = SUB168(auVar13 * ZEXT816(0x1000100010001),8);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = SUB168(auVar12 * ZEXT816(0x1000100010001),8);
          auVar97._8_8_ = 0;
          auVar97._0_8_ = SUB168(auVar11 * ZEXT816(0x1000100010001),8);
          auVar104._8_8_ = 0;
          auVar104._0_8_ = SUB168(auVar32 * ZEXT816(0x1000100010001),8);
          uVar23 = vpextrq_avx(auVar42._16_16_,1);
          uVar30 = vpextrq_avx(auVar45._0_16_,1);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = SUB168(auVar11 * ZEXT816(0x1000100010001),0);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = SUB168(auVar32 * ZEXT816(0x1000100010001),0);
          auVar39 = vpunpcklqdq_avx(auVar59,auVar39);
          auVar55._8_8_ = 0;
          auVar55._0_8_ = SUB168(auVar34 * ZEXT816(0x1000100010001),0);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = SUB168(auVar10 * ZEXT816(0x1000100010001),0);
          auVar36 = vpunpcklqdq_avx(auVar55,auVar61);
          auVar44 = vpaddq_avx512f(auVar44,auVar49);
          auVar49 = vmovdqu64_avx512f(auVar71);
          auVar35 = vpunpcklqdq_avx512vl(auVar102,auVar90);
          auVar37 = vpunpcklqdq_avx512vl(auVar104,auVar97);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = SUB168(auVar34 * ZEXT816(0x1000100010001),8);
          auVar38 = vpunpcklqdq_avx512vl(auVar93,auVar92);
          auVar40 = vinserti32x4_avx512vl(ZEXT1632(auVar37),auVar35,1);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar30;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = auVar45._16_8_;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar29;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = auVar42._0_8_;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar26;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = auVar42._16_8_;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar23;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = SUB168(auVar9 * ZEXT816(0x1000100010001),8);
          auVar35 = vpunpcklqdq_avx512vl(auVar99,auVar95);
          auVar41 = vinserti32x4_avx512vl(ZEXT1632(auVar35),auVar38,1);
          auVar45 = vinserti64x4_avx512f(ZEXT3264(auVar41),auVar40,1);
          auVar37 = vpunpcklqdq_avx512vl(auVar106,auVar101);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = SUB168(auVar20 * ZEXT816(0x1000100010001),0);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = SUB168(auVar18 * ZEXT816(0x1000100010001),0);
          auVar105._8_8_ = 0;
          auVar105._0_8_ = SUB168(auVar17 * ZEXT816(0x1000100010001),0);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = SUB168(auVar33 * ZEXT816(0x1000100010001),0);
          auVar68._8_8_ = 0;
          auVar68._0_8_ = SUB168(auVar9 * ZEXT816(0x1000100010001),0);
          auVar35 = vpunpcklqdq_avx(auVar68,auVar63);
          auVar40 = vinserti32x4_avx512vl(ZEXT1632(auVar39),auVar37,1);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = SUB168(auVar18 * ZEXT816(0x1000100010001),8);
          auVar89._8_8_ = 0;
          auVar89._0_8_ = SUB168(auVar17 * ZEXT816(0x1000100010001),8);
          auVar71 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar36,
                                                   ZEXT116(0) * auVar36 + ZEXT116(1) * auVar35)),
                               auVar40,1);
          auVar36 = vpunpcklqdq_avx512vl(auVar89,auVar87);
          auVar45 = vpaddq_avx512f(auVar45,auVar71);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = SUB168(auVar19 * ZEXT816(0x1000100010001),8);
          auVar69._8_8_ = 0;
          auVar69._0_8_ = SUB168(auVar20 * ZEXT816(0x1000100010001),8);
          auVar39 = vpunpcklqdq_avx(auVar65,auVar69);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = SUB168(auVar15 * ZEXT816(0x1000100010001),0);
          auVar98._8_8_ = 0;
          auVar98._0_8_ = SUB168(auVar16 * ZEXT816(0x1000100010001),0);
          auVar35 = vpunpcklqdq_avx512vl(auVar94,auVar98);
          auVar40._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar36;
          auVar40._16_16_ = ZEXT116(1) * auVar39;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = SUB168(auVar15 * ZEXT816(0x1000100010001),8);
          auVar83._8_8_ = 0;
          auVar83._0_8_ = SUB168(auVar16 * ZEXT816(0x1000100010001),8);
          auVar39 = vpunpcklqdq_avx512vl(auVar77,auVar83);
          auVar79._8_8_ = 0;
          auVar79._0_8_ = SUB168(auVar31 * ZEXT816(0x1000100010001),8);
          auVar85._8_8_ = 0;
          auVar85._0_8_ = SUB168(auVar14 * ZEXT816(0x1000100010001),8);
          auVar36 = vpunpcklqdq_avx512vl(auVar79,auVar85);
          uVar24 = uVar24 + 8;
          auVar50 = vmovdqa64_avx512f(auVar70);
          auVar70 = vpsrlq_avx512f(auVar47,0xf);
          auVar47 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar39,
                                                   ZEXT116(0) * auVar39 + ZEXT116(1) * auVar36)),
                               auVar40,1);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = SUB168(auVar19 * ZEXT816(0x1000100010001),0);
          auVar39 = vpunpcklqdq_avx512vl(auVar75,auVar81);
          auVar36 = vpunpcklqdq_avx512vl(auVar105,auVar103);
          auVar41._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar36;
          auVar41._16_16_ = ZEXT116(1) * auVar39;
          auVar51 = vmovdqa64_avx512f(auVar73);
          auVar73 = vpbroadcastq_avx512f(ZEXT816(0x1000100010001));
          auVar52 = vmovdqa64_avx512f(auVar72);
          auVar72 = vpbroadcastq_avx512f(ZEXT816(0x3801c00e007007));
          auVar73 = vpandq_avx512f(auVar70,auVar73);
          auVar96._8_8_ = 0;
          auVar96._0_8_ = SUB168(auVar31 * ZEXT816(0x1000100010001),0);
          auVar100._8_8_ = 0;
          auVar100._0_8_ = SUB168(auVar14 * ZEXT816(0x1000100010001),0);
          auVar39 = vpunpcklqdq_avx512vl(auVar96,auVar100);
          auVar44 = vpandq_avx512f(auVar44,auVar72);
          auVar45 = vpandq_avx512f(auVar45,auVar72);
          auVar70 = vpaddq_avx512f(auVar45,auVar50);
          auVar73 = vpaddq_avx512f(auVar73,auVar51);
          auVar53 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar35,
                                                   ZEXT116(0) * auVar35 + ZEXT116(1) * auVar39)),
                               auVar41,1);
          auVar45 = vmovdqa64_avx512f(auVar48);
          auVar71 = vpaddq_avx512f(auVar44,auVar49);
          auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar47 = vpaddq_avx512f(auVar47,auVar53);
          auVar72 = vpandq_avx512f(auVar47,auVar72);
          auVar72 = vpaddq_avx512f(auVar72,auVar52);
        } while ((((ulong)(uVar22 * 2) - 8 >> 3) + 8 & 0xfffffffffffffff8) != uVar24);
        auVar71 = vmovdqa64_avx512f(auVar71);
        auVar46._0_8_ =
             (ulong)(bVar2 & 1) * auVar71._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar49._0_8_;
        bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar46._8_8_ = (ulong)bVar3 * auVar71._8_8_ | (ulong)!bVar3 * auVar49._8_8_;
        bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar46._16_8_ = (ulong)bVar3 * auVar71._16_8_ | (ulong)!bVar3 * auVar49._16_8_;
        bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar46._24_8_ = (ulong)bVar3 * auVar71._24_8_ | (ulong)!bVar3 * auVar49._24_8_;
        bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar46._32_8_ = (ulong)bVar3 * auVar71._32_8_ | (ulong)!bVar3 * auVar49._32_8_;
        bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar46._40_8_ = (ulong)bVar3 * auVar71._40_8_ | (ulong)!bVar3 * auVar49._40_8_;
        bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar46._48_8_ = (ulong)bVar3 * auVar71._48_8_ | (ulong)!bVar3 * auVar49._48_8_;
        auVar46._56_8_ =
             (uVar4 >> 7) * auVar71._56_8_ | (ulong)!SUB81(uVar4 >> 7,0) * auVar49._56_8_;
        auVar40 = vextracti64x4_avx512f(auVar46,1);
        auVar70 = vmovdqa64_avx512f(auVar70);
        auVar71._0_8_ =
             (ulong)(bVar2 & 1) * auVar70._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar50._0_8_;
        bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar71._8_8_ = (ulong)bVar3 * auVar70._8_8_ | (ulong)!bVar3 * auVar50._8_8_;
        bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar71._16_8_ = (ulong)bVar3 * auVar70._16_8_ | (ulong)!bVar3 * auVar50._16_8_;
        bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar71._24_8_ = (ulong)bVar3 * auVar70._24_8_ | (ulong)!bVar3 * auVar50._24_8_;
        bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar71._32_8_ = (ulong)bVar3 * auVar70._32_8_ | (ulong)!bVar3 * auVar50._32_8_;
        bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar71._40_8_ = (ulong)bVar3 * auVar70._40_8_ | (ulong)!bVar3 * auVar50._40_8_;
        bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar71._48_8_ = (ulong)bVar3 * auVar70._48_8_ | (ulong)!bVar3 * auVar50._48_8_;
        auVar71._56_8_ =
             (uVar4 >> 7) * auVar70._56_8_ | (ulong)!SUB81(uVar4 >> 7,0) * auVar50._56_8_;
        auVar70 = vmovdqa64_avx512f(auVar72);
        auVar72._0_8_ =
             (ulong)(bVar2 & 1) * auVar70._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar52._0_8_;
        bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar72._8_8_ = (ulong)bVar3 * auVar70._8_8_ | (ulong)!bVar3 * auVar52._8_8_;
        bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar72._16_8_ = (ulong)bVar3 * auVar70._16_8_ | (ulong)!bVar3 * auVar52._16_8_;
        bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar72._24_8_ = (ulong)bVar3 * auVar70._24_8_ | (ulong)!bVar3 * auVar52._24_8_;
        bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar72._32_8_ = (ulong)bVar3 * auVar70._32_8_ | (ulong)!bVar3 * auVar52._32_8_;
        bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar72._40_8_ = (ulong)bVar3 * auVar70._40_8_ | (ulong)!bVar3 * auVar52._40_8_;
        bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar72._48_8_ = (ulong)bVar3 * auVar70._48_8_ | (ulong)!bVar3 * auVar52._48_8_;
        auVar72._56_8_ =
             (uVar4 >> 7) * auVar70._56_8_ | (ulong)!SUB81(uVar4 >> 7,0) * auVar52._56_8_;
        auVar70 = vmovdqa64_avx512f(auVar73);
        auVar73._0_8_ =
             (ulong)(bVar2 & 1) * auVar70._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar51._0_8_;
        bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar73._8_8_ = (ulong)bVar3 * auVar70._8_8_ | (ulong)!bVar3 * auVar51._8_8_;
        bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar73._16_8_ = (ulong)bVar3 * auVar70._16_8_ | (ulong)!bVar3 * auVar51._16_8_;
        bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar73._24_8_ = (ulong)bVar3 * auVar70._24_8_ | (ulong)!bVar3 * auVar51._24_8_;
        bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar73._32_8_ = (ulong)bVar3 * auVar70._32_8_ | (ulong)!bVar3 * auVar51._32_8_;
        bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar73._40_8_ = (ulong)bVar3 * auVar70._40_8_ | (ulong)!bVar3 * auVar51._40_8_;
        bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar73._48_8_ = (ulong)bVar3 * auVar70._48_8_ | (ulong)!bVar3 * auVar51._48_8_;
        auVar73._56_8_ =
             (uVar4 >> 7) * auVar70._56_8_ | (ulong)!SUB81(uVar4 >> 7,0) * auVar51._56_8_;
        auVar70 = vpaddq_avx512f(auVar46,ZEXT3264(auVar40));
        auVar39 = vpaddq_avx(auVar70._0_16_,auVar70._16_16_);
        auVar36 = vpshufd_avx(auVar39,0xee);
        auVar39 = vpaddq_avx(auVar39,auVar36);
        uVar25 = auVar39._0_8_;
        auVar40 = vextracti64x4_avx512f(auVar71,1);
        auVar70 = vpaddq_avx512f(auVar71,ZEXT3264(auVar40));
        auVar39 = vpaddq_avx(auVar70._0_16_,auVar70._16_16_);
        auVar40 = vextracti64x4_avx512f(auVar72,1);
        auVar70 = vpaddq_avx512f(auVar72,ZEXT3264(auVar40));
        auVar36 = vpaddq_avx(auVar70._0_16_,auVar70._16_16_);
        auVar40 = vextracti64x4_avx512f(auVar73,1);
        auVar70 = vpaddq_avx512f(auVar73,ZEXT3264(auVar40));
        auVar35 = vpaddq_avx(auVar70._0_16_,auVar70._16_16_);
        auVar37 = vpshufd_avx(auVar35,0xee);
        vpaddq_avx(auVar35,auVar37);
        auVar43 = vmovdqu64_avx512f(auVar43);
        auVar35 = vpunpckhqdq_avx(auVar39,auVar36);
        auVar39 = vpunpcklqdq_avx(auVar39,auVar36);
        auVar39 = vpaddq_avx(auVar39,auVar35);
        auVar40 = ZEXT1632(auVar39);
        in = in + uVar27;
      }
      auVar41 = vpermq_avx2(auVar40,0xd0);
      auVar42 = vpbroadcastq_avx512vl();
      uVar21 = vpextrq_avx(auVar40._0_16_,1);
      auVar39 = vpsrlq_avx(auVar40._0_16_,0x19);
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0x30201000a0908));
      n = n - uVar27;
      auVar41 = vpblendd_avx2(auVar42,auVar41,0x3c);
      auVar41 = vpsrlvq_avx2(auVar41,_DAT_0011d020);
      auVar36 = vpshufd_avx(auVar39,0xe8);
      auVar39 = vpinsrd_avx(ZEXT416(auVar40._4_4_ >> 0x13),(uint)((ulong)uVar21 >> 0x33),1);
      auVar35 = vpmovqd_avx512vl(auVar41);
      auVar56._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar35;
      auVar56._16_16_ = ZEXT116(1) * auVar36;
      auVar41 = vpbroadcastd_avx512vl();
      auVar41 = vpblendd_avx2(auVar56,auVar41,0x40);
      auVar42 = vpbroadcastd_avx512vl();
      auVar41 = vpblendd_avx2(auVar41,auVar42,0x80);
      auVar42._8_4_ = 0xfff;
      auVar42._0_8_ = 0xfff00000fff;
      auVar42._12_4_ = 0xfff;
      auVar42._16_4_ = 0xfff;
      auVar42._20_4_ = 0xfff;
      auVar42._24_4_ = 0xfff;
      auVar42._28_4_ = 0xfff;
      auVar41 = vpandd_avx512vl(auVar41,auVar42);
      auVar36 = vpinsrd_avx(ZEXT416((uint)uVar25 & 0xfff),auVar40._0_4_ & 0xfff,1);
      auVar36 = vpinsrd_avx(auVar36,(uint)uVar21 & 0xfff,2);
      auVar36 = vpinsrd_avx(auVar36,(uint)((ulong)uVar25 >> 0x33),3);
      auVar70 = vpermt2q_avx512f(ZEXT3264(auVar41),auVar70,
                                 ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                     ZEXT116(1) * auVar39,
                                                     ZEXT116(0) * auVar39 + ZEXT116(1) * auVar36)));
      auVar73 = vpbroadcastd_avx512f();
      auVar48._56_4_ = auVar73._56_4_;
      auVar73 = vpbroadcastd_avx512f();
      auVar48._0_56_ = auVar70._0_56_;
      auVar48._60_4_ = auVar73._60_4_;
      auVar43 = vpaddd_avx512f(auVar43,auVar48);
      auVar70 = vmovdqu64_avx512f(auVar43);
      *(undefined1 (*) [64])out = auVar70;
    } while (3 < n);
  }
  if (n != 0) {
    puVar1 = in + n;
    do {
      uVar24 = (ulong)*in;
      lVar28 = 0;
      do {
        out[lVar28] = out[lVar28] + ((uint)uVar24 & 1);
        uVar24 = uVar24 >> 1;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 0x10);
      in = in + 1;
    } while (in != puVar1);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_umul128(const uint16_t* in, uint32_t n, uint32_t* out) {
    const uint64_t mask_bits = UINT64_C(0x1249124912491249); // 00000000 00000100 01110000 00010010 10001110 10110000 01101010 11110001
    const uint64_t mask_cnts = UINT64_C(0x003801C00E007007); // 00000000 00111000 00000001 11000000 00001110 00000000 01110000 00001000
    const uint64_t mask_0001 = UINT64_C(0x0001000100010001); // 00000000 00000001 00000000 00000001 00000000 00000001 00000000 00000001

    while (n >= 4) {
        uint64_t counter_a = 0; // 5 packed 12-bit counters (4 unused bits).
        uint64_t counter_b = 0;
        uint64_t counter_c = 0;
        uint64_t counter_d = 0;

        // Terminate before overflowing the counters.
        uint32_t len = ((n < 0x0FFF) ? n : 0x0FFF) & ~3;
        n -= len;
        for (const uint16_t* end = &in[len]; in != end; in += 4) {
            uint64_t v = pospopcnt_loadu_u64(in);
            uint64_t a = v & mask_bits;         // 0b0001001001001001
            uint64_t b = (v >> 1)  & mask_bits; // 0b0010010010010010 >> 1
            uint64_t c = (v >> 2)  & mask_bits; // 0b0100100100100100 >> 2
            uint64_t d = (v >> 15) & mask_0001; // 0b1000000000000000 >> 15
            uint64_t hi_a, hi_b, hi_c;
            a = pospopcnt_umul128(a, mask_0001, &hi_a);
            b = pospopcnt_umul128(b, mask_0001, &hi_b);
            c = pospopcnt_umul128(c, mask_0001, &hi_c);
            a += hi_a; // Broadcast 3-bit counts.
            b += hi_b;
            c += hi_c;
            counter_a += a & mask_cnts;
            counter_b += b & mask_cnts;
            counter_c += c & mask_cnts;
            counter_d += d;
        }

        out[0]  += counter_a & 0x0FFF;
        out[1]  += counter_b & 0x0FFF;
        out[2]  += counter_c & 0x0FFF;
        out[3]  += (counter_a >> 51);
        out[4]  += (counter_b >> 51);
        out[5]  += (counter_c >> 51);
        out[6]  += (counter_a >> 38) & 0x0FFF;
        out[7]  += (counter_b >> 38) & 0x0FFF;
        out[8]  += (counter_c >> 38) & 0x0FFF;
        out[9]  += (counter_a >> 25) & 0x0FFF;
        out[10] += (counter_b >> 25) & 0x0FFF;
        out[11] += (counter_c >> 25) & 0x0FFF;
        out[12] += (counter_a >> 12) & 0x0FFF;
        out[13] += (counter_b >> 12) & 0x0FFF;
        out[14] += (counter_c >> 12) & 0x0FFF;
        out[15] += (counter_d * mask_0001) >> 48;
    }

    // Residual words.
    for (const uint16_t* tail_end = &in[n]; in != tail_end; ++in) {
        uint16_t x = *in;
        for (int i = 0; i != 16; ++i) {
            out[i] += x & 1;
            x >>= 1;
        }
    }

    return 0;
}